

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

uint * cimg_library::cimg::_exception_mode(uint value,bool is_set)

{
  if (Mutex_attr()::val == '\0') {
    _exception_mode();
  }
  pthread_mutex_lock((pthread_mutex_t *)Mutex_attr()::val);
  if (is_set) {
    _exception_mode::mode = value;
  }
  if (Mutex_attr()::val == '\0') {
    _exception_mode();
  }
  pthread_mutex_unlock((pthread_mutex_t *)Mutex_attr()::val);
  return &_exception_mode::mode;
}

Assistant:

inline unsigned int& _exception_mode(const unsigned int value, const bool is_set) {
      static unsigned int mode = cimg_verbosity;
      cimg::mutex(0);
      if (is_set) mode = value;
      cimg::mutex(0,0);
      return mode;
    }